

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O2

void __thiscall w3Module::read_globals(w3Module *this,uint8_t **cursor)

{
  pointer pGVar1;
  w3GlobalType wVar2;
  uint32_t uVar3;
  long lVar4;
  size_t i;
  ulong uVar5;
  ulong __new_size;
  
  uVar3 = read_varuint32(this,cursor);
  __new_size = (ulong)uVar3;
  printf("reading globals6 size:%lX\n",__new_size);
  std::vector<Global,_std::allocator<Global>_>::resize(&this->globals,__new_size);
  lVar4 = 8;
  for (uVar5 = 0; __new_size != uVar5; uVar5 = uVar5 + 1) {
    pGVar1 = (this->globals).super__Vector_base<Global,_std::allocator<Global>_>._M_impl.
             super__Vector_impl_data._M_start;
    wVar2 = read_globaltype(this,cursor);
    *(w3GlobalType *)((long)pGVar1 + lVar4 + -8) = wVar2;
    printf("read_globals %lX:%lX value_type:%X  mutable:%X init:%p\n",uVar5,__new_size,
           (ulong)(ushort)wVar2 & 0xff,(ulong)((ushort)wVar2 >> 8),*cursor);
    DecodeInstructions(this,(vector<w3DecodedInstruction,_std::allocator<w3DecodedInstruction>_> *)
                            (&(pGVar1->global_type).value_type + lVar4),cursor,(w3Code *)0x0);
    lVar4 = lVar4 + 0x20;
  }
  printf("read globals6 size:%lX\n",__new_size);
  return;
}

Assistant:

void w3Module::read_globals (uint8_t** cursor)
{
    //printf ("reading section 6\n");
    const size_t size = read_varuint32 (cursor);
    printf ("reading globals6 size:%" FORMAT_SIZE "X\n", size);
    globals.resize (size);
    for (size_t i = 0; i < size; ++i)
    {
        Global& a = globals [i];
        a.global_type = read_globaltype (cursor);
        printf ("read_globals %" FORMAT_SIZE "X:%" FORMAT_SIZE "X value_type:%X  mutable:%X init:%p\n", i, size, a.global_type.value_type, a.global_type.is_mutable, *cursor);
        DecodeInstructions (this, a.init, cursor, 0);
        // Init points to code -- Instructions until end of block 0x0B Instruction.
    }
    printf ("read globals6 size:%" FORMAT_SIZE "X\n", size);
}